

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive.hpp
# Opt level: O0

result_type __thiscall
pstore::serialize::archive::writer_base<pstore::serialize::archive::details::database_writer_policy>
::put<pstore::uint128>
          (writer_base<pstore::serialize::archive::details::database_writer_policy> *this,uint128 *t
          )

{
  result_type rVar1;
  uint128 *t_local;
  writer_base<pstore::serialize::archive::details::database_writer_policy> *this_local;
  result_type r;
  
  if ((this->flushed_ & 1U) == 0) {
    rVar1 = details::database_writer_policy::put<pstore::uint128>(&this->policy_,t);
    this->bytes_consumed_ = this->bytes_consumed_ + 0x10;
    return (result_type)rVar1.a_;
  }
  assert_failed("!flushed_",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/serialize/archive.hpp"
                ,0xa3);
}

Assistant:

auto put (Ty const & t) -> result_type {
                    static_assert (std::is_standard_layout<Ty>::value,
                                   "writer_base can only write standard-layout types!");
                    PSTORE_ASSERT (!flushed_);
                    result_type r = policy_.put (t);
                    bytes_consumed_ += sizeof (t);
                    return r;
                }